

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int message_set_delivery_annotations(MESSAGE_HANDLE message,delivery_annotations annotations)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE pAVar2;
  LOGGER_LOG l_1;
  delivery_annotations new_delivery_annotations;
  LOGGER_LOG l;
  int result;
  delivery_annotations annotations_local;
  MESSAGE_HANDLE message_local;
  
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                ,"message_set_delivery_annotations",0x208,1,"NULL message");
    }
    l._4_4_ = 0x209;
  }
  else if (annotations == (delivery_annotations)0x0) {
    if (message->delivery_annotations != (delivery_annotations)0x0) {
      amqpvalue_destroy(message->delivery_annotations);
      message->delivery_annotations = (delivery_annotations)0x0;
    }
    l._4_4_ = 0;
  }
  else {
    pAVar2 = amqpvalue_clone(annotations);
    if (pAVar2 == (AMQP_VALUE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                  ,"message_set_delivery_annotations",0x223,1,"Cannot clone delivery annotations");
      }
      l._4_4_ = 0x224;
    }
    else {
      if (message->delivery_annotations != (delivery_annotations)0x0) {
        amqpvalue_destroy(message->delivery_annotations);
      }
      message->delivery_annotations = pAVar2;
      l._4_4_ = 0;
    }
  }
  return l._4_4_;
}

Assistant:

int message_set_delivery_annotations(MESSAGE_HANDLE message, delivery_annotations annotations)
{
    int result;

    if (message == NULL)
    {
        /* Codes_SRS_MESSAGE_01_034: [ If `message` is NULL, `message_set_delivery_annotations` shall fail and return a non-zero value. ]*/
        LogError("NULL message");
        result = MU_FAILURE;
    }
    else
    {
        delivery_annotations new_delivery_annotations;

        if (annotations == NULL)
        {
            /* Codes_SRS_MESSAGE_01_141: [ If `annotations` is NULL, the previously stored delivery annotations associated with `message` shall be freed. ]*/
            if (message->delivery_annotations != NULL)
            {
                annotations_destroy(message->delivery_annotations);
                message->delivery_annotations = NULL;
            }

            /* Codes_SRS_MESSAGE_01_033: [ On success it shall return 0. ]*/
            result = 0;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_032: [ `message_set_delivery_annotations` shall copy the contents of `annotations` as the delivery annotations for the message instance identified by `message`. ]*/
            /* Codes_SRS_MESSAGE_01_035: [ Cloning the delivery annotations shall be done by calling `annotations_clone`. ]*/
            new_delivery_annotations = annotations_clone(annotations);
            if (new_delivery_annotations == NULL)
            {
                /* Codes_SRS_MESSAGE_01_036: [ If `annotations_clone` fails, `message_set_delivery_annotations` shall fail and return a non-zero value. ]*/
                LogError("Cannot clone delivery annotations");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_140: [** If setting the delivery annotations fails, the previous value shall be preserved. ]*/
                /* Only do the free of the previous value if we could clone the new one*/
                if (message->delivery_annotations != NULL)
                {
                    annotations_destroy(message->delivery_annotations);
                }

                message->delivery_annotations = new_delivery_annotations;

                /* Codes_SRS_MESSAGE_01_033: [ On success it shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}